

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::IncrementFunction::eval
          (ConstantValue *__return_storage_ptr__,IncrementFunction *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *param_4)

{
  bool bVar1;
  SVInt local_e8;
  SVInt local_d8;
  SVInt local_c8;
  undefined4 local_b8;
  undefined1 local_a8 [8];
  DimResult dim;
  Args *args_local;
  EvalContext *context_local;
  IncrementFunction *this_local;
  SourceRange param_3_local;
  
  dim._104_8_ = args;
  ArrayQueryFunction::getDim((DimResult *)local_a8,&this->super_ArrayQueryFunction,context,args);
  if (((byte)dim.range.left & 1) == 0) {
    if ((dim.range.left._2_1_ & 1) == 0) {
      if (((dim.range.left._1_1_ & 1) == 0) &&
         (dim.map.defaultValue.value.
          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ._32_8_ == 0)) {
        bVar1 = ConstantRange::isLittleEndian((ConstantRange *)&dim.indexType);
        SVInt::SVInt(&local_e8,0x20,(ulong)bVar1 - 1 | 1,true);
        slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_e8);
        SVInt::~SVInt(&local_e8);
      }
      else {
        SVInt::SVInt(&local_d8,0x20,0xffffffffffffffff,true);
        slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_d8);
        SVInt::~SVInt(&local_d8);
      }
    }
    else {
      SVInt::createFillX(&local_c8,0x20,true);
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_c8);
      SVInt::~SVInt(&local_c8);
    }
  }
  else {
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
  }
  local_b8 = 1;
  ArrayQueryFunction::DimResult::~DimResult((DimResult *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue IncrementFunction::eval(EvalContext& context, const Args& args, SourceRange,
                                      const CallExpression::SystemCallInfo&) const {
    DimResult dim = getDim(context, args);
    if (dim.hardFail)
        return nullptr;

    if (dim.outOfRange)
        return SVInt::createFillX(32, true);

    if (dim.isDynamic || dim.indexType)
        return SVInt(32, uint64_t(-1), true);

    return SVInt(32, uint64_t(dim.range.isLittleEndian() ? 1 : -1), true);
}